

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.cpp
# Opt level: O3

BBox * __thiscall CMU462::Vertex::bounds(BBox *__return_storage_ptr__,Vertex *this)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  BBox BStack_68;
  
  (__return_storage_ptr__->max).x = -INFINITY;
  (__return_storage_ptr__->max).y = -INFINITY;
  (__return_storage_ptr__->max).z = -INFINITY;
  (__return_storage_ptr__->min).x = INFINITY;
  (__return_storage_ptr__->min).y = INFINITY;
  (__return_storage_ptr__->min).z = INFINITY;
  (__return_storage_ptr__->extent).x = -INFINITY;
  (__return_storage_ptr__->extent).y = -INFINITY;
  (__return_storage_ptr__->extent).z = -INFINITY;
  p_Var2 = (this->_halfedge)._M_node;
  p_Var3 = p_Var2;
  do {
    p_Var1 = p_Var3[3]._M_prev;
    if (*(char *)&p_Var1[0xc]._M_next == '\0') {
      (*(code *)(p_Var1[1]._M_next)->_M_prev)(&BStack_68,p_Var1 + 1);
      BBox::expand(__return_storage_ptr__,&BStack_68);
      p_Var2 = (this->_halfedge)._M_node;
    }
    p_Var3 = p_Var3[1]._M_prev[2]._M_next;
  } while (p_Var3 != p_Var2);
  return __return_storage_ptr__;
}

Assistant:

BBox Vertex::bounds() const
  {
    BBox box;

    // grow the bounding box to contain
    // all faces that touch this vertex
    HalfedgeCIter h = halfedge();
    do
    {
      FaceCIter f = h->face();
      if( !f->isBoundary() )
      {
        box.expand( f->bounds() );
      }

      h = h->twin()->next();
    }
    while( h != halfedge() );

    return box;
  }